

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall pugi::xml_text::as_bool(xml_text *this,bool def)

{
  bool bVar1;
  xml_node_struct *pxVar2;
  
  pxVar2 = _data(this);
  if ((pxVar2 != (xml_node_struct *)0x0) && (pxVar2->value != (char_t *)0x0)) {
    bVar1 = impl::anon_unknown_0::get_value_bool(pxVar2->value);
    return bVar1;
  }
  return def;
}

Assistant:

PUGI__FN bool xml_text::as_bool(bool def) const
	{
		xml_node_struct* d = _data();
		if (!d) return def;
		const char_t* value = d->value;
		return value ? impl::get_value_bool(value) : def;
	}